

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileCheckpointWriter::CreateCheckpoint(SingleFileCheckpointWriter *this)

{
  unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true> *this_00;
  _Head_base<0UL,_duckdb::MetadataWriter_*,_false> _Var1;
  SchemaCatalogEntry *pSVar2;
  pointer prVar3;
  pointer prVar4;
  pointer prVar5;
  _func_int **pp_Var6;
  bool bVar7;
  int iVar8;
  DBConfig *pDVar9;
  StorageManager *this_01;
  BlockManager *pBVar10;
  MetadataManager *args;
  pointer pMVar11;
  DuckCatalog *this_02;
  undefined4 extraout_var;
  DependencyManager *this_03;
  type stream;
  reference pvVar12;
  idx_t iVar13;
  WriteAheadLog *pWVar14;
  FatalException *pFVar15;
  reference_wrapper<duckdb::CatalogEntry> *table;
  pointer prVar16;
  long lVar17;
  size_type sVar18;
  reference_wrapper<duckdb::ViewCatalogEntry> *view;
  pointer prVar19;
  pointer prVar20;
  idx_t i;
  size_type __n;
  MetaBlockPointer meta_block;
  catalog_entry_vector_t tables;
  vector<std::reference_wrapper<duckdb::ViewCatalogEntry>,_true> views;
  idx_t local_690;
  catalog_entry_vector_t catalog_entries;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> schemas;
  _Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  local_608;
  idx_t iStack_5e8;
  idx_t local_5d0;
  undefined8 uStack_5c8;
  _Any_data local_5b8;
  code *local_5a8;
  code *local_5a0;
  undefined1 local_598 [56];
  BinarySerializer serializer;
  
  pDVar9 = DBConfig::Get((this->super_CheckpointWriter).db);
  this_01 = AttachedDatabase::GetStorageManager((this->super_CheckpointWriter).db);
  bVar7 = StorageManager::InMemory(this_01);
  if (!bVar7) {
    pBVar10 = GetBlockManager(this);
    args = GetMetadataManager(this);
    make_uniq<duckdb::MetadataWriter,duckdb::MetadataManager&>((duckdb *)&serializer,args);
    pp_Var6 = serializer.super_Serializer._vptr_Serializer;
    serializer.super_Serializer._vptr_Serializer = (_func_int **)0x0;
    _Var1._M_head_impl =
         (this->metadata_writer).
         super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>
         .super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl;
    (this->metadata_writer).
    super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t.
    super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>.
    super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl = (MetadataWriter *)pp_Var6;
    if ((_Var1._M_head_impl != (MetadataWriter *)0x0) &&
       ((**(code **)(*(long *)&(_Var1._M_head_impl)->super_WriteStream + 0x10))(),
       serializer.super_Serializer._vptr_Serializer != (_func_int **)0x0)) {
      (**(code **)(*serializer.super_Serializer._vptr_Serializer + 0x10))();
    }
    this_00 = &this->metadata_writer;
    make_uniq<duckdb::MetadataWriter,duckdb::MetadataManager&>((duckdb *)&serializer,args);
    pp_Var6 = serializer.super_Serializer._vptr_Serializer;
    serializer.super_Serializer._vptr_Serializer = (_func_int **)0x0;
    _Var1._M_head_impl =
         (this->table_metadata_writer).
         super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>
         .super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl;
    (this->table_metadata_writer).
    super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t.
    super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>.
    super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl = (MetadataWriter *)pp_Var6;
    if ((_Var1._M_head_impl != (MetadataWriter *)0x0) &&
       ((**(code **)(*(long *)&(_Var1._M_head_impl)->super_WriteStream + 0x10))(),
       serializer.super_Serializer._vptr_Serializer != (_func_int **)0x0)) {
      (**(code **)(*serializer.super_Serializer._vptr_Serializer + 0x10))();
    }
    pMVar11 = unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true>
              ::operator->(this_00);
    meta_block = MetadataWriter::GetMetaBlockPointer(pMVar11);
    schemas.
    super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    schemas.
    super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    schemas.
    super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_02 = (DuckCatalog *)Catalog::GetCatalog((this->super_CheckpointWriter).db);
    local_5b8._8_8_ = 0;
    local_5b8._M_unused._M_object = &schemas;
    local_5a0 = ::std::
                _Function_handler<void_(duckdb::SchemaCatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/checkpoint_manager.cpp:153:22)>
                ::_M_invoke;
    local_5a8 = ::std::
                _Function_handler<void_(duckdb::SchemaCatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/checkpoint_manager.cpp:153:22)>
                ::_M_manager;
    DuckCatalog::ScanSchemas(this_02,(function<void_(duckdb::SchemaCatalogEntry_&)> *)&local_5b8);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_5b8);
    catalog_entries.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    catalog_entries.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    catalog_entries.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar8 = (*(this_02->super_Catalog)._vptr_Catalog[0x1a])(this_02);
    serializer.super_Serializer._vptr_Serializer = (_func_int **)CONCAT44(extraout_var,iVar8);
    this_03 = optional_ptr<duckdb::DependencyManager,_true>::operator*
                        ((optional_ptr<duckdb::DependencyManager,_true> *)&serializer);
    prVar5 = schemas.
             super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_608._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_608._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_608._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    prVar20 = schemas.
              super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      local_690 = meta_block.block_pointer;
      if (prVar20 == prVar5) break;
      pSVar2 = prVar20->_M_data;
      serializer.super_Serializer._vptr_Serializer = (_func_int **)pSVar2;
      ::std::
      vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
      ::emplace_back<std::reference_wrapper<duckdb::CatalogEntry>>
                ((vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
                  *)&local_608,(reference_wrapper<duckdb::CatalogEntry> *)&serializer);
      serializer.super_Serializer.options.serialize_enum_as_string = false;
      serializer.super_Serializer.options.serialize_default_values = false;
      serializer.super_Serializer.options._2_6_ = 0;
      serializer.super_Serializer.options.serialization_compatibility.duckdb_version.
      _M_string_length =
           (size_type)
           ::std::
           _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/checkpoint_manager.cpp:68:40)>
           ::_M_invoke;
      serializer.super_Serializer.options.serialization_compatibility.duckdb_version._M_dataplus.
      _M_p = (pointer)::std::
                      _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/checkpoint_manager.cpp:68:40)>
                      ::_M_manager;
      serializer.super_Serializer._vptr_Serializer = (_func_int **)&local_608;
      (*(pSVar2->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x11])
                (pSVar2,8,&serializer);
      ::std::_Function_base::~_Function_base((_Function_base *)&serializer);
      serializer.super_Serializer.options.serialize_enum_as_string = false;
      serializer.super_Serializer.options.serialize_default_values = false;
      serializer.super_Serializer.options._2_6_ = 0;
      serializer.super_Serializer.options.serialization_compatibility.duckdb_version.
      _M_string_length =
           (size_type)
           ::std::
           _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/checkpoint_manager.cpp:75:44)>
           ::_M_invoke;
      serializer.super_Serializer.options.serialization_compatibility.duckdb_version._M_dataplus.
      _M_p = (pointer)::std::
                      _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/checkpoint_manager.cpp:75:44)>
                      ::_M_manager;
      serializer.super_Serializer._vptr_Serializer = (_func_int **)&local_608;
      (*(pSVar2->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x11])
                (pSVar2,6,&serializer);
      ::std::_Function_base::~_Function_base((_Function_base *)&serializer);
      tables.
      super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tables.
      super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tables.
      super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      views.
      super_vector<std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::ViewCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::ViewCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      views.
      super_vector<std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::ViewCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::ViewCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      views.
      super_vector<std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::ViewCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::ViewCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      serializer.super_Serializer.options.serialization_compatibility.duckdb_version.
      _M_string_length =
           (size_type)
           ::std::
           _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/checkpoint_manager.cpp:84:41)>
           ::_M_invoke;
      serializer.super_Serializer.options.serialization_compatibility.duckdb_version._M_dataplus.
      _M_p = (pointer)::std::
                      _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/checkpoint_manager.cpp:84:41)>
                      ::_M_manager;
      serializer.super_Serializer._vptr_Serializer = (_func_int **)&tables;
      serializer.super_Serializer.options._0_8_ = &views;
      (*(pSVar2->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x11])
                (pSVar2,1,&serializer);
      ::std::_Function_base::~_Function_base((_Function_base *)&serializer);
      ReorderTableEntries(&tables);
      prVar3 = tables.
               super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (prVar16 = tables.
                     super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          prVar4 = views.
                   super_vector<std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::ViewCatalogEntry>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::ViewCatalogEntry>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
          prVar19 = views.
                    super_vector<std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::ViewCatalogEntry>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::ViewCatalogEntry>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, prVar16 != prVar3;
          prVar16 = prVar16 + 1) {
        serializer.super_Serializer._vptr_Serializer = (_func_int **)prVar16->_M_data;
        ::std::
        vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
        ::emplace_back<std::reference_wrapper<duckdb::CatalogEntry>>
                  ((vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
                    *)&local_608,(reference_wrapper<duckdb::CatalogEntry> *)&serializer);
      }
      for (; prVar19 != prVar4; prVar19 = prVar19 + 1) {
        serializer.super_Serializer._vptr_Serializer = (_func_int **)prVar19->_M_data;
        ::std::
        vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
        ::emplace_back<std::reference_wrapper<duckdb::CatalogEntry>>
                  ((vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
                    *)&local_608,(reference_wrapper<duckdb::CatalogEntry> *)&serializer);
      }
      serializer.super_Serializer.options.serialize_enum_as_string = false;
      serializer.super_Serializer.options.serialize_default_values = false;
      serializer.super_Serializer.options._2_6_ = 0;
      serializer.super_Serializer.options.serialization_compatibility.duckdb_version.
      _M_string_length =
           (size_type)
           ::std::
           _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/checkpoint_manager.cpp:105:51)>
           ::_M_invoke;
      serializer.super_Serializer.options.serialization_compatibility.duckdb_version._M_dataplus.
      _M_p = (pointer)::std::
                      _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/checkpoint_manager.cpp:105:51)>
                      ::_M_manager;
      serializer.super_Serializer._vptr_Serializer = (_func_int **)&local_608;
      (*(pSVar2->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x11])
                (pSVar2,0x1a,&serializer);
      ::std::_Function_base::~_Function_base((_Function_base *)&serializer);
      serializer.super_Serializer.options.serialize_enum_as_string = false;
      serializer.super_Serializer.options.serialize_default_values = false;
      serializer.super_Serializer.options._2_6_ = 0;
      serializer.super_Serializer.options.serialization_compatibility.duckdb_version.
      _M_string_length =
           (size_type)
           ::std::
           _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/checkpoint_manager.cpp:114:50)>
           ::_M_invoke;
      serializer.super_Serializer.options.serialization_compatibility.duckdb_version._M_dataplus.
      _M_p = (pointer)::std::
                      _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/checkpoint_manager.cpp:114:50)>
                      ::_M_manager;
      serializer.super_Serializer._vptr_Serializer = (_func_int **)&local_608;
      (*(pSVar2->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x11])
                (pSVar2,0x19,&serializer);
      ::std::_Function_base::~_Function_base((_Function_base *)&serializer);
      serializer.super_Serializer.options.serialize_enum_as_string = false;
      serializer.super_Serializer.options.serialize_default_values = false;
      serializer.super_Serializer.options._2_6_ = 0;
      serializer.super_Serializer.options.serialization_compatibility.duckdb_version.
      _M_string_length =
           (size_type)
           ::std::
           _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/checkpoint_manager.cpp:123:41)>
           ::_M_invoke;
      serializer.super_Serializer.options.serialization_compatibility.duckdb_version._M_dataplus.
      _M_p = (pointer)::std::
                      _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/checkpoint_manager.cpp:123:41)>
                      ::_M_manager;
      serializer.super_Serializer._vptr_Serializer = (_func_int **)&local_608;
      (*(pSVar2->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x11])
                (pSVar2,4,&serializer);
      ::std::_Function_base::~_Function_base((_Function_base *)&serializer);
      ::std::
      _Vector_base<std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::ViewCatalogEntry>_>_>
      ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::ViewCatalogEntry>_>_>
                       *)&views);
      ::std::
      _Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
      ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                       *)&tables);
      prVar20 = prVar20 + 1;
    }
    ::std::
    vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ::_M_move_assign(&catalog_entries.
                      super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                     ,&local_608);
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ::~_Vector_base(&local_608);
    DependencyManager::ReorderEntries
              (this_03,(catalog_entry_vector_t *)
                       &catalog_entries.
                        super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
              );
    stream = unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true>::
             operator*(this_00);
    SerializationOptions::SerializationOptions
              ((SerializationOptions *)local_598,(this->super_CheckpointWriter).db);
    BinarySerializer::BinarySerializer
              (&serializer,&stream->super_WriteStream,(SerializationOptions *)local_598);
    ::std::__cxx11::string::~string((string *)(local_598 + 8));
    BinarySerializer::OnObjectBegin(&serializer);
    lVar17 = (long)catalog_entries.
                   super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)catalog_entries.
                   super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    (*serializer.super_Serializer._vptr_Serializer[2])(&serializer,100,"catalog_entries");
    sVar18 = lVar17 >> 3;
    (*serializer.super_Serializer._vptr_Serializer[8])(&serializer,sVar18);
    for (__n = 0; sVar18 != __n; __n = __n + 1) {
      pvVar12 = vector<std::reference_wrapper<duckdb::CatalogEntry>,_true>::get<true>
                          (&catalog_entries,__n);
      (*serializer.super_Serializer._vptr_Serializer[6])(&serializer);
      CheckpointWriter::WriteEntry
                (&this->super_CheckpointWriter,pvVar12->_M_data,&serializer.super_Serializer);
      (*serializer.super_Serializer._vptr_Serializer[7])(&serializer);
    }
    (*serializer.super_Serializer._vptr_Serializer[9])();
    (*serializer.super_Serializer._vptr_Serializer[3])();
    BinarySerializer::OnObjectEnd(&serializer);
    pMVar11 = unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true>
              ::operator->(this_00);
    MetadataWriter::Flush(pMVar11);
    pMVar11 = unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true>
              ::operator->(&this->table_metadata_writer);
    MetadataWriter::Flush(pMVar11);
    iVar13 = StorageManager::GetWALSize(this_01);
    if (iVar13 != 0) {
      tables.
      super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)StorageManager::GetWAL(this_01);
      pWVar14 = optional_ptr<duckdb::WriteAheadLog,_true>::operator->
                          ((optional_ptr<duckdb::WriteAheadLog,_true> *)&tables);
      WriteAheadLog::WriteCheckpoint(pWVar14,meta_block);
      pWVar14 = optional_ptr<duckdb::WriteAheadLog,_true>::operator->
                          ((optional_ptr<duckdb::WriteAheadLog,_true> *)&tables);
      WriteAheadLog::Flush(pWVar14);
    }
    if ((pDVar9->options).checkpoint_abort == DEBUG_ABORT_BEFORE_HEADER) {
      pFVar15 = (FatalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&tables,
                 "Checkpoint aborted before header write because of PRAGMA checkpoint_abort flag",
                 (allocator *)&views);
      FatalException::FatalException(pFVar15,(string *)&tables);
      __cxa_throw(pFVar15,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_5d0 = optional_idx::GetIndex(&pBVar10->block_alloc_size);
    iStack_5e8 = local_690;
    uStack_5c8 = 0x800;
    (*pBVar10->_vptr_BlockManager[0xf])(pBVar10);
    if ((pDVar9->options).checkpoint_abort == DEBUG_ABORT_BEFORE_TRUNCATE) {
      pFVar15 = (FatalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&tables,
                 "Checkpoint aborted before truncate because of PRAGMA checkpoint_abort flag",
                 (allocator *)&views);
      FatalException::FatalException(pFVar15,(string *)&tables);
      __cxa_throw(pFVar15,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    (*pBVar10->_vptr_BlockManager[0x15])();
    if (iVar13 != 0) {
      StorageManager::ResetWAL(this_01);
    }
    BinarySerializer::~BinarySerializer(&serializer);
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                     *)&catalog_entries);
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                     *)&schemas);
  }
  return;
}

Assistant:

void SingleFileCheckpointWriter::CreateCheckpoint() {
	auto &config = DBConfig::Get(db);
	auto &storage_manager = db.GetStorageManager().Cast<SingleFileStorageManager>();
	if (storage_manager.InMemory()) {
		return;
	}
	// assert that the checkpoint manager hasn't been used before
	D_ASSERT(!metadata_writer);

	auto &block_manager = GetBlockManager();
	auto &metadata_manager = GetMetadataManager();

	//! Set up the writers for the checkpoints
	metadata_writer = make_uniq<MetadataWriter>(metadata_manager);
	table_metadata_writer = make_uniq<MetadataWriter>(metadata_manager);

	// get the id of the first meta block
	auto meta_block = metadata_writer->GetMetaBlockPointer();

	vector<reference<SchemaCatalogEntry>> schemas;
	// we scan the set of committed schemas
	auto &catalog = Catalog::GetCatalog(db).Cast<DuckCatalog>();
	catalog.ScanSchemas([&](SchemaCatalogEntry &entry) { schemas.push_back(entry); });

	catalog_entry_vector_t catalog_entries;
	D_ASSERT(catalog.IsDuckCatalog());

	auto &dependency_manager = *catalog.GetDependencyManager();
	catalog_entries = GetCatalogEntries(schemas);
	dependency_manager.ReorderEntries(catalog_entries);

	// write the actual data into the database

	// Create a serializer to write the checkpoint data
	// The serialized format is roughly:
	/*
	    {
	        schemas: [
	            {
	                schema: <schema_info>,
	                custom_types: [ { type: <type_info> }, ... ],
	                sequences: [ { sequence: <sequence_info> }, ... ],
	                tables: [ { table: <table_info> }, ... ],
	                views: [ { view: <view_info> }, ... ],
	                macros: [ { macro: <macro_info> }, ... ],
	                table_macros: [ { table_macro: <table_macro_info> }, ... ],
	                indexes: [ { index: <index_info>, root_offset <block_ptr> }, ... ]
	            }
	        ]
	    }
	 */
	BinarySerializer serializer(*metadata_writer, SerializationOptions(db));
	serializer.Begin();
	serializer.WriteList(100, "catalog_entries", catalog_entries.size(), [&](Serializer::List &list, idx_t i) {
		auto &entry = catalog_entries[i];
		list.WriteObject([&](Serializer &obj) { WriteEntry(entry.get(), obj); });
	});
	serializer.End();

	metadata_writer->Flush();
	table_metadata_writer->Flush();

	// write a checkpoint flag to the WAL
	// this protects against the rare event that the database crashes AFTER writing the file, but BEFORE truncating the
	// WAL we write an entry CHECKPOINT "meta_block_id" into the WAL upon loading, if we see there is an entry
	// CHECKPOINT "meta_block_id", and the id MATCHES the head idin the file we know that the database was successfully
	// checkpointed, so we know that we should avoid replaying the WAL to avoid duplicating data
	bool wal_is_empty = storage_manager.GetWALSize() == 0;
	if (!wal_is_empty) {
		auto wal = storage_manager.GetWAL();
		wal->WriteCheckpoint(meta_block);
		wal->Flush();
	}

	if (config.options.checkpoint_abort == CheckpointAbort::DEBUG_ABORT_BEFORE_HEADER) {
		throw FatalException("Checkpoint aborted before header write because of PRAGMA checkpoint_abort flag");
	}

	// finally write the updated header
	DatabaseHeader header;
	header.meta_block = meta_block.block_pointer;
	header.block_alloc_size = block_manager.GetBlockAllocSize();
	header.vector_size = STANDARD_VECTOR_SIZE;
	block_manager.WriteHeader(header);

#ifdef DUCKDB_BLOCK_VERIFICATION
	// extend verify_block_usage_count
	auto metadata_info = storage_manager.GetMetadataInfo();
	for (auto &info : metadata_info) {
		verify_block_usage_count[info.block_id]++;
	}
	for (auto &entry_ref : catalog_entries) {
		auto &entry = entry_ref.get();
		if (entry.type == CatalogType::TABLE_ENTRY) {
			auto &table = entry.Cast<DuckTableEntry>();
			auto &storage = table.GetStorage();
			auto segment_info = storage.GetColumnSegmentInfo();
			for (auto &segment : segment_info) {
				verify_block_usage_count[segment.block_id]++;
				if (StringUtil::Contains(segment.segment_info, "Overflow String Block Ids: ")) {
					auto overflow_blocks = StringUtil::Replace(segment.segment_info, "Overflow String Block Ids: ", "");
					auto splits = StringUtil::Split(overflow_blocks, ", ");
					for (auto &split : splits) {
						auto overflow_block_id = std::stoll(split);
						verify_block_usage_count[overflow_block_id]++;
					}
				}
			}
		}
	}
	block_manager.VerifyBlocks(verify_block_usage_count);
#endif

	if (config.options.checkpoint_abort == CheckpointAbort::DEBUG_ABORT_BEFORE_TRUNCATE) {
		throw FatalException("Checkpoint aborted before truncate because of PRAGMA checkpoint_abort flag");
	}

	// truncate the file
	block_manager.Truncate();

	// truncate the WAL
	if (!wal_is_empty) {
		storage_manager.ResetWAL();
	}
}